

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall
cppjieba::DictTrie::CalculateWeight
          (DictTrie *this,
          vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *node_infos,double sum)

{
  DictUnit *pDVar1;
  reference pvVar2;
  double dVar3;
  DictUnit *node_info;
  size_t i;
  double sum_local;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *node_infos_local;
  DictTrie *this_local;
  
  if (sum <= 0.0) {
    __assert_fail("sum > 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/DictTrie.hpp"
                  ,0xfc,"void cppjieba::DictTrie::CalculateWeight(vector<DictUnit> &, double) const"
                 );
  }
  node_info = (DictUnit *)0x0;
  while( true ) {
    pDVar1 = (DictUnit *)
             std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::size(node_infos);
    if (pDVar1 <= node_info) {
      return;
    }
    pvVar2 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::operator[]
                       (node_infos,(size_type)node_info);
    if (pvVar2->weight <= 0.0) break;
    dVar3 = log(pvVar2->weight / sum);
    pvVar2->weight = dVar3;
    node_info = (DictUnit *)((long)(node_info->word).buffer_ + 1);
  }
  __assert_fail("node_info.weight > 0.0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/DictTrie.hpp"
                ,0xff,"void cppjieba::DictTrie::CalculateWeight(vector<DictUnit> &, double) const");
}

Assistant:

void CalculateWeight(vector<DictUnit>& node_infos, double sum) const {
    assert(sum > 0.0);
    for (size_t i = 0; i < node_infos.size(); i++) {
      DictUnit& node_info = node_infos[i];
      assert(node_info.weight > 0.0);
      node_info.weight = log(double(node_info.weight)/sum);
    }
  }